

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O0

int __thiscall DIS::ArealObjectStatePdu::getMarshalledSize(ArealObjectStatePdu *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  const_reference pvVar9;
  undefined1 local_40 [8];
  Vector3Double listElement;
  unsigned_long_long idx;
  int marshalSize;
  ArealObjectStatePdu *this_local;
  
  iVar2 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_objectID);
  iVar4 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar5 = EntityType::getMarshalledSize(&this->_objectType);
  iVar6 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar7 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + iVar5 + 0xc + iVar6 + iVar7;
  listElement._z = 0.0;
  while( true ) {
    dVar1 = listElement._z;
    dVar8 = (double)std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::size
                              (&this->_objectLocation);
    if ((ulong)dVar8 <= (ulong)dVar1) break;
    pvVar9 = std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::operator[]
                       (&this->_objectLocation,(size_type)listElement._z);
    Vector3Double::Vector3Double((Vector3Double *)local_40,pvVar9);
    iVar2 = Vector3Double::getMarshalledSize((Vector3Double *)local_40);
    idx._4_4_ = idx._4_4_ + iVar2;
    Vector3Double::~Vector3Double((Vector3Double *)local_40);
    listElement._z = (double)((long)listElement._z + 1);
  }
  return idx._4_4_;
}

Assistant:

int ArealObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _modifications
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType
   marshalSize = marshalSize + 4;  // _specificObjectAppearance
   marshalSize = marshalSize + 2;  // _generalObjectAppearance
   marshalSize = marshalSize + 2;  // _numberOfPoints
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID

   for(unsigned long long idx=0; idx < _objectLocation.size(); idx++)
   {
        Vector3Double listElement = _objectLocation[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}